

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_player_spells(void)

{
  ulong uVar1;
  long lVar2;
  
  wr_u16b((uint16_t)(player->class->magic).total_spells);
  lVar2 = 0;
  while( true ) {
    uVar1 = (ulong)(player->class->magic).total_spells;
    if ((long)uVar1 <= lVar2) break;
    wr_byte(player->spell_flags[lVar2]);
    lVar2 = lVar2 + 1;
  }
  for (lVar2 = 0; lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    wr_byte(player->spell_order[lVar2]);
    uVar1 = (ulong)(uint)(player->class->magic).total_spells;
  }
  return;
}

Assistant:

void wr_player_spells(void)
{
	int i;

	wr_u16b(player->class->magic.total_spells);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_flags[i]);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_order[i]);
}